

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::bindtexture(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType ctxType;
  GLuint texture [5];
  GLuint local_48;
  GLuint local_44;
  GLuint local_40;
  GLuint local_3c;
  GLuint local_38;
  string local_30;
  
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,5,&local_48);
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "GL_INVALID_ENUM is generated if target is not one of the allowable values.","");
  NegativeTestContext::beginSection(ctx,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0,1);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8d40,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if texture was previously created with a target that doesn\'t match that of target."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_48);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,local_48);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,local_48);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,local_48);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,local_44);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_44);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,local_44);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,local_44);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,local_40);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_40);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,local_40);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,local_40);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,local_3c);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_3c);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,local_3c);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,local_3c);
  NegativeTestContext::expectError(ctx,0x502);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_OES_texture_cube_map_array");
    if (!bVar2) goto LAB_015eadaa;
  }
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,local_48);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,local_44);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,local_40);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,local_3c);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,local_38);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_38);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,local_38);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,local_38);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,local_38);
  NegativeTestContext::expectError(ctx,0x502);
LAB_015eadaa:
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,5,&local_48);
  return;
}

Assistant:

void bindtexture (NegativeTestContext& ctx)
{
	GLuint texture[5];
	ctx.glGenTextures(5, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the allowable values.");
	ctx.glBindTexture(0, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBindTexture(GL_FRAMEBUFFER, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if texture was previously created with a target that doesn't match that of target.");
	ctx.glBindTexture(GL_TEXTURE_2D, texture[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_3D, texture[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[1]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBindTexture(GL_TEXTURE_2D, texture[1]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_3D, texture[1]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[1]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindTexture(GL_TEXTURE_3D, texture[2]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBindTexture(GL_TEXTURE_2D, texture[2]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[2]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[2]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[3]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBindTexture(GL_TEXTURE_2D, texture[3]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[3]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_3D, texture[3]);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[0]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[1]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[2]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[3]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[4]);
		ctx.expectError(GL_NO_ERROR);
		ctx.glBindTexture(GL_TEXTURE_2D, texture[4]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[4]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_3D, texture[4]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[4]);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(5, texture);
}